

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaEnumBuilder::setMetaType(QMetaEnumBuilder *this,QMetaType metaType)

{
  QMetaEnumBuilderPrivate *pQVar1;
  bool value;
  
  pQVar1 = d_func(this);
  if (pQVar1 != (QMetaEnumBuilderPrivate *)0x0) {
    (pQVar1->metaType).d_ptr = metaType.d_ptr;
    if (metaType.d_ptr == (QMetaTypeInterface *)0x0) {
      value = false;
    }
    else {
      value = 4 < (metaType.d_ptr)->size;
    }
    setIs64Bit(this,value);
    return;
  }
  return;
}

Assistant:

void QMetaEnumBuilder::setMetaType(QMetaType metaType)
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d) {
        d->metaType = metaType;
        setIs64Bit(metaType.sizeOf() > 4);
    }
}